

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O1

void __thiscall DataRefs::GetWeather(DataRefs *this,float *hPa,string *stationId,string *METAR)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&mutexDrUpdate);
  if (iVar1 == 0) {
    *hPa = this->lastWeatherHPA;
    std::__cxx11::string::_M_assign((string *)stationId);
    std::__cxx11::string::_M_assign((string *)METAR);
    pthread_mutex_unlock((pthread_mutex_t *)&mutexDrUpdate);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void DataRefs::GetWeather (float& hPa, std::string& stationId, std::string& METAR)
{
    // protected against reads from the main thread
    std::lock_guard<std::recursive_mutex> lock(mutexDrUpdate);
    
    hPa = lastWeatherHPA;
    stationId = lastWeatherStationId;
    METAR = lastWeatherMETAR;
}